

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O3

QChar * QIPAddressUtils::checkedToAscii(Buffer *buffer,QChar *begin,QChar *end)

{
  char16_t *pcVar1;
  undefined1 *puVar2;
  long aalloc;
  long asize;
  
  asize = ((long)end - (long)begin >> 1) + 1;
  aalloc = (buffer->super_QVLABase<char>).super_QVLABaseBase.a;
  if (aalloc <= asize) {
    aalloc = asize;
  }
  QVLABase<char>::reallocate_impl
            (&buffer->super_QVLABase<char>,0x40,&buffer->super_QVLAStorage<1UL,_1UL,_64LL>,asize,
             aalloc);
  (buffer->super_QVLABase<char>).super_QVLABaseBase.s = asize;
  puVar2 = (undefined1 *)(buffer->super_QVLABase<char>).super_QVLABaseBase.ptr;
  if (end != begin) {
    do {
      pcVar1 = &begin->ucs;
      if (0x7e < (ushort)*pcVar1) {
        return begin;
      }
      begin = begin + 1;
      *puVar2 = (char)*pcVar1;
      puVar2 = puVar2 + 1;
    } while (begin != end);
  }
  *puVar2 = 0;
  return (QChar *)0x0;
}

Assistant:

static const QChar *checkedToAscii(Buffer &buffer, const QChar *begin, const QChar *end)
{
    const auto *const ubegin = reinterpret_cast<const char16_t *>(begin);
    const auto *const uend = reinterpret_cast<const char16_t *>(end);
    auto *src = ubegin;

    buffer.resize(uend - ubegin + 1);
    char *dst = buffer.data();

    while (src != uend) {
        if (*src >= 0x7f)
            return reinterpret_cast<const QChar *>(src);
        *dst++ = *src++;
    }
    *dst = '\0';
    return nullptr;
}